

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

String Bstrlib::operator+(char c,String *b)

{
  uchar *extraout_RDX;
  undefined7 in_register_00000039;
  String SVar1;
  String SStack_28;
  
  String::String(&SStack_28,(char)b);
  String::operator+((String *)CONCAT71(in_register_00000039,c),&SStack_28);
  String::~String(&SStack_28);
  SVar1.super_tagbstring.data = extraout_RDX;
  SVar1.super_tagbstring._0_8_ = (String *)CONCAT71(in_register_00000039,c);
  return (String)SVar1.super_tagbstring;
}

Assistant:

const String operator+(char c, const String& b)
    {
        return String(c) + b;
    }